

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# annotator.cpp
# Opt level: O0

void __thiscall
Annotator_errorHandling_Test::~Annotator_errorHandling_Test(Annotator_errorHandling_Test *this)

{
  Annotator_errorHandling_Test *this_local;
  
  ~Annotator_errorHandling_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Annotator, errorHandling)
{
    auto model = libcellml::Model::create("model");
    auto annotator = libcellml::Annotator::create();

    EXPECT_EQ(libcellml::CellmlElementType::UNDEFINED, annotator->item("i_dont_exist")->type());
    EXPECT_EQ(size_t(1), annotator->issueCount());

    // Building an empty model will result in an empty map.
    annotator->setModel(model);

    // Test that an unfound identifier that is expected to be unique doesn't raise an issue.
    EXPECT_EQ(libcellml::CellmlElementType::UNDEFINED, annotator->item("i_dont_exist")->type());
    EXPECT_EQ(size_t(1), annotator->issueCount());

    // Test that an Issue is created and logged when an identifier is not found.
    EXPECT_EQ(libcellml::CellmlElementType::UNDEFINED, annotator->item("i_dont_exist", 2)->type());
    EXPECT_EQ(size_t(1), annotator->issueCount());

    // Test that repeated calls to the same unfound identifier generate new errors.
    EXPECT_EQ(libcellml::CellmlElementType::UNDEFINED, annotator->item("i_dont_exist", 2)->type());
    EXPECT_EQ(size_t(1), annotator->issueCount());
}